

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O2

EVP_MD * GetDigest(FileTest *t,string *name)

{
  bool bVar1;
  EVP_MD *pEVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  AssertHelper local_18;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t,
                          "MD5");
  if (bVar1) {
    pEVar2 = EVP_md5();
    return (EVP_MD *)pEVar2;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t,
                          "SHA1");
  if (bVar1) {
    pEVar2 = EVP_sha1();
    return (EVP_MD *)pEVar2;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t,
                          "SHA224");
  if (bVar1) {
    pEVar2 = EVP_sha224();
    return (EVP_MD *)pEVar2;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t,
                          "SHA256");
  if (bVar1) {
    pEVar2 = EVP_sha256();
    return (EVP_MD *)pEVar2;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t,
                          "SHA384");
  if (bVar1) {
    pEVar2 = EVP_sha384();
    return (EVP_MD *)pEVar2;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t,
                          "SHA512");
  if (bVar1) {
    pEVar2 = EVP_sha512();
    return (EVP_MD *)pEVar2;
  }
  testing::Message::Message((Message *)&local_20);
  std::operator<<((ostream *)(local_20._M_head_impl + 0x10),"Unknown digest: ");
  std::operator<<((ostream *)(local_20._M_head_impl + 0x10),(string *)t);
  testing::internal::AssertHelper::AssertHelper
            (&local_18,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
             ,0x3e,"Failed");
  testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_20);
  testing::internal::AssertHelper::~AssertHelper(&local_18);
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return (EVP_MD *)0x0;
}

Assistant:

static const EVP_MD *GetDigest(FileTest *t, const std::string &name) {
  if (name == "MD5") {
    return EVP_md5();
  } else if (name == "SHA1") {
    return EVP_sha1();
  } else if (name == "SHA224") {
    return EVP_sha224();
  } else if (name == "SHA256") {
    return EVP_sha256();
  } else if (name == "SHA384") {
    return EVP_sha384();
  } else if (name == "SHA512") {
    return EVP_sha512();
  }
  ADD_FAILURE() << "Unknown digest: " << name;
  return nullptr;
}